

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitBdd.c
# Opt level: O2

DdNode * Kit_SopToBdd(DdManager *dd,Kit_Sop_t *cSop,int nVars)

{
  uint uVar1;
  uint uVar2;
  DdNode *n;
  DdNode *n_00;
  DdNode *pDVar3;
  ulong uVar4;
  byte bVar5;
  ulong uVar6;
  int i;
  
  if (0xf < nVars) {
    __assert_fail("nVars < 16",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kitBdd.c"
                  ,0x38,"DdNode *Kit_SopToBdd(DdManager *, Kit_Sop_t *, int)");
  }
  n = Cudd_ReadLogicZero(dd);
  Cudd_Ref(n);
  uVar4 = 0;
  uVar6 = (ulong)(uint)nVars;
  if (nVars < 1) {
    uVar6 = uVar4;
  }
  do {
    if (((long)cSop->nCubes <= (long)uVar4) || (uVar1 = cSop->pCubes[uVar4], uVar1 == 0)) {
      Cudd_Deref(n);
      return n;
    }
    n_00 = Cudd_ReadOne(dd);
    Cudd_Ref(n_00);
    bVar5 = 0;
    for (i = 0; (int)uVar6 != i; i = i + 1) {
      uVar2 = uVar1 >> (bVar5 & 0x1f) & 3;
      if (uVar2 == 2) {
        pDVar3 = Cudd_bddIthVar(dd,i);
LAB_00479f6d:
        pDVar3 = Cudd_bddAnd(dd,n_00,pDVar3);
        Cudd_Ref(pDVar3);
        Cudd_RecursiveDeref(dd,n_00);
      }
      else {
        pDVar3 = n_00;
        if (uVar2 == 1) {
          pDVar3 = Cudd_bddIthVar(dd,i);
          pDVar3 = (DdNode *)((ulong)pDVar3 ^ 1);
          goto LAB_00479f6d;
        }
      }
      bVar5 = bVar5 + 2;
      n_00 = pDVar3;
    }
    pDVar3 = Cudd_bddOr(dd,n,n_00);
    Cudd_Ref(pDVar3);
    Cudd_RecursiveDeref(dd,n);
    Cudd_RecursiveDeref(dd,n_00);
    uVar4 = uVar4 + 1;
    n = pDVar3;
  } while( true );
}

Assistant:

DdNode * Kit_SopToBdd( DdManager * dd, Kit_Sop_t * cSop, int nVars )
{
    DdNode * bSum, * bCube, * bTemp, * bVar;
    unsigned uCube;
    int Value, i, v;
    assert( nVars < 16 );
    // start the cover
    bSum = Cudd_ReadLogicZero(dd);   Cudd_Ref( bSum );
   // check the logic function of the node
    Kit_SopForEachCube( cSop, uCube, i )
    {
        bCube = Cudd_ReadOne(dd);   Cudd_Ref( bCube );
        for ( v = 0; v < nVars; v++ )
        {
            Value = ((uCube >> 2*v) & 3);
            if ( Value == 1 )
                bVar = Cudd_Not( Cudd_bddIthVar( dd, v ) );
            else if ( Value == 2 )
                bVar = Cudd_bddIthVar( dd, v );
            else
                continue;
            bCube  = Cudd_bddAnd( dd, bTemp = bCube, bVar );   Cudd_Ref( bCube );
            Cudd_RecursiveDeref( dd, bTemp );
        }
        bSum = Cudd_bddOr( dd, bTemp = bSum, bCube );   
        Cudd_Ref( bSum );
        Cudd_RecursiveDeref( dd, bTemp );
        Cudd_RecursiveDeref( dd, bCube );
    }
    // complement the result if necessary
    Cudd_Deref( bSum );
    return bSum;
}